

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall Loop::SetHasYield(Loop *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Loop *local_18;
  Loop *current;
  Loop *this_local;
  
  local_18 = this;
  while ((*(ushort *)&local_18->field_0x178 >> 4 & 1) == 0) {
    *(ushort *)&local_18->field_0x178 = *(ushort *)&local_18->field_0x178 & 0xffef | 0x10;
    local_18 = local_18->parent;
    if (local_18 == (Loop *)0x0) {
      return;
    }
  }
  local_18 = local_18->parent;
  do {
    if (local_18 == (Loop *)0x0) {
      return;
    }
    if ((*(ushort *)&local_18->field_0x178 >> 4 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xddb,"(current->hasYield)","current->hasYield");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_18 = local_18->parent;
  } while( true );
}

Assistant:

void
Loop::SetHasYield()
{
    Loop* current = this;
    do
    {
        if (current->hasYield)
        {
#if DBG
            current = current->parent;
            while (current)
            {
                Assert(current->hasYield);
                current = current->parent;
            }
#endif
            break;
        }
        current->hasYield = true;
        current = current->parent;
    } while (current != nullptr);
}